

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

size_t __thiscall bloaty::anon_unknown_0::StringViewToSize(anon_unknown_0 *this,string_view str)

{
  bool bVar1;
  Arg *in_R8;
  string_view format;
  string_view text;
  uint64_t val;
  string local_60;
  anon_unknown_0 *local_40;
  char *local_38;
  
  text._M_str = (char *)str._M_len;
  text._M_len = (size_t)this;
  bVar1 = absl::numbers_internal::safe_strtou64_base(text,(Nonnull<uint64_t_*>)&local_40,10);
  if (bVar1) {
    return (size_t)local_40;
  }
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"couldn\'t convert string \'$0\' to integer.";
  local_40 = this;
  local_38 = text._M_str;
  absl::Substitute_abi_cxx11_(&local_60,(absl *)0x28,format,in_R8);
  Throw(local_60._M_dataplus._M_p,0x34);
}

Assistant:

size_t StringViewToSize(string_view str) {
  size_t ret;
  if (!absl::SimpleAtoi(str, &ret)) {
    THROWF("couldn't convert string '$0' to integer.", str);
  }
  return ret;
}